

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int32_suite::test_array16_int32(void)

{
  value vVar1;
  value_type expected [8];
  value_type input [11];
  decoder decoder;
  undefined8 local_78;
  value local_70 [2];
  uchar local_68 [16];
  decoder local_58;
  
  local_68[0] = 0xbc;
  local_68[1] = '\b';
  local_68[2] = '\0';
  local_68[3] = '\x11';
  local_68[4] = '\"';
  local_68[5] = '3';
  local_68[6] = 'D';
  local_68[7] = 'U';
  local_68[8] = 'f';
  local_68[9] = 'w';
  local_68[10] = 0x88;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[11]>
            (&local_58,(uchar (*) [11])local_68);
  local_70[0] = array16_int32;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8c9,"void compact_int32_suite::test_array16_int32()",&local_78,local_70);
  local_78._0_4_ = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_70[0] = error_expected_end_record;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8ca,"void compact_int32_suite::test_array16_int32()",&local_78,local_70);
  vVar1 = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_78 = CONCAT44(local_78._4_4_,vVar1);
  local_70[0] = error_unexpected_token;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8cb,"void compact_int32_suite::test_array16_int32()",&local_78,local_70);
  local_78 = 0x8877665544332211;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8d2,"void compact_int32_suite::test_array16_int32()",local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,&local_78,local_70);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_70[0] = local_58.current.code;
  local_70[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8d4,"void compact_int32_suite::test_array16_int32()",local_70,local_70 + 1);
  return;
}

Assistant:

void test_array16_int32()
{
    const value_type input[] = { token::code::array16_int32, 0x08, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_int32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44,
        0x55, 0x66, 0x77, 0x88
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}